

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DecimalFormat::toLocalizedPattern(DecimalFormat *this,UnicodeString *result)

{
  int iVar1;
  undefined4 extraout_var;
  ErrorCode localStatus;
  ErrorCode local_60;
  UnicodeString local_50;
  
  local_60._vptr_ErrorCode = (_func_int **)&PTR__ErrorCode_003ea548;
  local_60.errorCode = U_ZERO_ERROR;
  iVar1 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x4d])();
  UnicodeString::operator=(result,(UnicodeString *)CONCAT44(extraout_var,iVar1));
  icu_63::number::impl::PatternStringUtils::convertLocalized
            (&local_50,result,
             (this->fields->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,
             true,&local_60.errorCode);
  UnicodeString::moveFrom(result,&local_50);
  UnicodeString::~UnicodeString(&local_50);
  ErrorCode::~ErrorCode(&local_60);
  return result;
}

Assistant:

UnicodeString& DecimalFormat::toLocalizedPattern(UnicodeString& result) const {
    ErrorCode localStatus;
    result = toPattern(result);
    result = PatternStringUtils::convertLocalized(result, *fields->symbols, true, localStatus);
    return result;
}